

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb_alsa.c
# Opt level: O2

void alsa_stream_destroy(cubeb_stream_conflict1 *stm)

{
  pthread_mutex_t *ppVar1;
  uint *puVar2;
  cubeb_conflict1 *pcVar3;
  cubeb_conflict1 *pcVar4;
  long lVar5;
  long lVar6;
  snd_pcm_t *pcm;
  
  pcVar3 = stm->context;
  if (stm->other_stream != (cubeb_stream_conflict1 *)0x0) {
    stm->other_stream->other_stream = (cubeb_stream_conflict1 *)0x0;
    alsa_stream_destroy(stm->other_stream);
  }
  ppVar1 = &stm->mutex;
  pthread_mutex_lock((pthread_mutex_t *)ppVar1);
  pcm = stm->pcm;
  if (pcm != (snd_pcm_t *)0x0) {
    if (stm->state == DRAINING) {
      (*cubeb_snd_pcm_drain)(pcm);
      pcm = stm->pcm;
    }
    alsa_locked_pcm_close(pcm);
    stm->pcm = (snd_pcm_t *)0x0;
  }
  free(stm->saved_fds);
  pthread_mutex_unlock((pthread_mutex_t *)ppVar1);
  pthread_mutex_destroy((pthread_mutex_t *)ppVar1);
  pthread_cond_destroy((pthread_cond_t *)&stm->cond);
  pcVar4 = stm->context;
  pthread_mutex_lock((pthread_mutex_t *)&pcVar4->mutex);
  lVar5 = 0;
  do {
    lVar6 = lVar5;
    if (lVar6 == 0x10) goto LAB_001208f4;
    lVar5 = lVar6 + 1;
  } while (pcVar4->streams[lVar6] != stm);
  pcVar4->streams[lVar6] = (cubeb_stream_conflict1 *)0x0;
LAB_001208f4:
  pthread_mutex_unlock((pthread_mutex_t *)&pcVar4->mutex);
  ppVar1 = &pcVar3->mutex;
  pthread_mutex_lock((pthread_mutex_t *)ppVar1);
  puVar2 = &pcVar3->active_streams;
  *puVar2 = *puVar2 - 1;
  pthread_mutex_unlock((pthread_mutex_t *)ppVar1);
  free(stm->buffer);
  free(stm);
  return;
}

Assistant:

static void
alsa_stream_destroy(cubeb_stream * stm)
{
  int r;
  cubeb * ctx;

  assert(stm && (stm->state == INACTIVE ||
                 stm->state == ERROR ||
                 stm->state == DRAINING));

  ctx = stm->context;

  if (stm->other_stream) {
    stm->other_stream->other_stream = NULL; // to stop infinite recursion
    alsa_stream_destroy(stm->other_stream);
  }

  pthread_mutex_lock(&stm->mutex);
  if (stm->pcm) {
    if (stm->state == DRAINING) {
      WRAP(snd_pcm_drain)(stm->pcm);
    }
    alsa_locked_pcm_close(stm->pcm);
    stm->pcm = NULL;
  }
  free(stm->saved_fds);
  pthread_mutex_unlock(&stm->mutex);
  pthread_mutex_destroy(&stm->mutex);

  r = pthread_cond_destroy(&stm->cond);
  assert(r == 0);

  alsa_unregister_stream(stm);

  pthread_mutex_lock(&ctx->mutex);
  assert(ctx->active_streams >= 1);
  ctx->active_streams -= 1;
  pthread_mutex_unlock(&ctx->mutex);

  free(stm->buffer);

  free(stm);
}